

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void basisu::vector<basisu::image>::object_mover(void *pDst_void,void *pSrc_void,uint32_t num)

{
  image *piVar1;
  uint in_EDX;
  image *in_RSI;
  image *pDst;
  image *pSrc_end;
  image *pSrc;
  image *local_20;
  undefined4 in_stack_ffffffffffffffe8;
  
  piVar1 = in_RSI + in_EDX;
  for (local_20 = in_RSI; local_20 != piVar1; local_20 = local_20 + 1) {
    image::image(in_RSI,(image *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    image::~image((image *)0x48cd80);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint32_t num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            // placement new
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            ++pSrc;
            ++pDst;
         }
      }